

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_write_signature_restartable
              (mbedtls_ecdsa_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hlen,
              uchar *sig,size_t sig_size,size_t *slen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng,mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  undefined1 local_70 [8];
  mbedtls_mpi s;
  mbedtls_mpi r;
  int ret;
  size_t sig_size_local;
  uchar *sig_local;
  size_t hlen_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_ecdsa_context *ctx_local;
  
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    ctx_local._4_4_ = -0x4f80;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)&s.s);
    mbedtls_mpi_init((mbedtls_mpi *)local_70);
    r._12_4_ = mbedtls_ecdsa_sign_det_restartable
                         (&ctx->grp,(mbedtls_mpi *)&s.s,(mbedtls_mpi *)local_70,&ctx->d,hash,hlen,
                          md_alg,f_rng,p_rng,rs_ctx);
    if (r._12_4_ == 0) {
      r._12_4_ = ecdsa_signature_to_asn1
                           ((mbedtls_mpi *)&s.s,(mbedtls_mpi *)local_70,sig,sig_size,slen);
    }
    mbedtls_mpi_free((mbedtls_mpi *)&s.s);
    mbedtls_mpi_free((mbedtls_mpi *)local_70);
    ctx_local._4_4_ = r._12_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_write_signature_restartable(mbedtls_ecdsa_context *ctx,
                                              mbedtls_md_type_t md_alg,
                                              const unsigned char *hash, size_t hlen,
                                              unsigned char *sig, size_t sig_size, size_t *slen,
                                              int (*f_rng)(void *, unsigned char *, size_t),
                                              void *p_rng,
                                              mbedtls_ecdsa_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    if (f_rng == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&r);
    mbedtls_mpi_init(&s);

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign_det_restartable(&ctx->grp, &r, &s, &ctx->d,
                                                       hash, hlen, md_alg, f_rng,
                                                       p_rng, rs_ctx));
#else
    (void) md_alg;

#if defined(MBEDTLS_ECDSA_SIGN_ALT)
    (void) rs_ctx;

    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign(&ctx->grp, &r, &s, &ctx->d,
                                       hash, hlen, f_rng, p_rng));
#else
    /* Use the same RNG for both blinding and ephemeral key generation */
    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign_restartable(&ctx->grp, &r, &s, &ctx->d,
                                                   hash, hlen, f_rng, p_rng, f_rng,
                                                   p_rng, rs_ctx));
#endif /* MBEDTLS_ECDSA_SIGN_ALT */
#endif /* MBEDTLS_ECDSA_DETERMINISTIC */

    MBEDTLS_MPI_CHK(ecdsa_signature_to_asn1(&r, &s, sig, sig_size, slen));

cleanup:
    mbedtls_mpi_free(&r);
    mbedtls_mpi_free(&s);

    return ret;
}